

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O3

void __thiscall Lock::~Lock(Lock *this)

{
  uint uVar1;
  TArray<OneKey,_OneKey> *this_00;
  ulong uVar2;
  
  if ((this->keylist).Count != 0) {
    uVar2 = 0;
    do {
      this_00 = &(this->keylist).Array[uVar2]->anykeylist;
      if (this_00 != (TArray<OneKey,_OneKey> *)0x0) {
        TArray<OneKey,_OneKey>::~TArray(this_00);
      }
      operator_delete(this_00,0x10);
      uVar2 = uVar2 + 1;
      uVar1 = (this->keylist).Count;
    } while (uVar2 < uVar1);
    if (uVar1 != 0) {
      (this->keylist).Count = 0;
    }
  }
  FString::~FString(&this->RemoteMsg);
  FString::~FString(&this->Message);
  TArray<FSoundID,_FSoundID>::~TArray(&this->locksound);
  TArray<Keygroup_*,_Keygroup_*>::~TArray(&this->keylist);
  return;
}

Assistant:

~Lock()
	{
		for(unsigned int i=0;i<keylist.Size();i++) delete keylist[i];
		keylist.Clear();
	}